

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O3

void __thiscall
AnalyserExternalVariable_containsDependencyByPointer_Test::TestBody
          (AnalyserExternalVariable_containsDependencyByPointer_Test *this)

{
  char cVar1;
  string sVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  AnalyserExternalVariablePtr externalVariable;
  VariablePtr dependency;
  ModelPtr model;
  ParserPtr parser;
  AssertionResult local_b8;
  long local_a8 [3];
  long *local_90;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  long local_80 [2];
  long *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  AssertHelper local_60 [8];
  shared_ptr *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string local_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string local_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml","");
  fileContents((string *)&local_b8);
  libcellml::Parser::parseModel(local_38);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  local_90 = (long *)0x0;
  local_58 = (shared_ptr *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_b8,"size_t(0)","parser->issueCount()",(unsigned_long *)&local_90,
             (unsigned_long *)&local_58);
  if ((string)local_b8.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_b8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_b8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0xb8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (((local_90 != (long *)0x0) && (cVar1 = testing::internal::IsTrue(true), cVar1 != '\0')) &&
       (local_90 != (long *)0x0)) {
      (**(code **)(*local_90 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  sVar2 = local_38[0];
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"membrane","");
  libcellml::ComponentEntity::component((string *)&local_70,(bool)sVar2);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"V","");
  libcellml::Component::variable(local_48);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)&local_58);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"membrane","");
  libcellml::ComponentEntity::component((string *)&local_70,(bool)local_38[0]);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Cm","");
  libcellml::Component::variable(local_48);
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  libcellml::AnalyserExternalVariable::addDependency(local_58);
  sVar2 = (string)libcellml::AnalyserExternalVariable::containsDependency(local_58);
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90._0_1_ = sVar2;
  if (sVar2 == (string)0x0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(char *)&local_90,"externalVariable->containsDependency(dependency)",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0xbf,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(local_60,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    if ((long *)local_b8._0_8_ != local_a8) {
      operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
    }
    if (((local_70 != (long *)0x0) && (cVar1 = testing::internal::IsTrue(true), cVar1 != '\0')) &&
       (local_70 != (long *)0x0)) {
      (**(code **)(*local_70 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._0_8_ = (long *)0x0;
  local_b8.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  cVar1 = libcellml::AnalyserExternalVariable::containsDependency(local_58);
  local_90 = (long *)(CONCAT71(local_90._1_7_,cVar1) ^ 1);
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_b8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (cVar1 == '\0') goto LAB_0012c261;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8.message_.ptr_);
    if (((ulong)local_90 & 1) != 0) goto LAB_0012c261;
  }
  testing::Message::Message((Message *)&local_70);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_b8,(char *)&local_90,"externalVariable->containsDependency(nullptr)","true");
  testing::internal::AssertHelper::AssertHelper
            (local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
             ,0xc0,(char *)local_b8._0_8_);
  testing::internal::AssertHelper::operator=(local_60,(Message *)&local_70);
  testing::internal::AssertHelper::~AssertHelper(local_60);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  if (((local_70 != (long *)0x0) && (cVar1 = testing::internal::IsTrue(true), cVar1 != '\0')) &&
     (local_70 != (long *)0x0)) {
    (**(code **)(*local_70 + 8))();
  }
LAB_0012c261:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(AnalyserExternalVariable, containsDependencyByPointer)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));
    auto dependency = model->component("membrane")->variable("Cm");

    externalVariable->addDependency(dependency);

    EXPECT_TRUE(externalVariable->containsDependency(dependency));
    EXPECT_FALSE(externalVariable->containsDependency(nullptr));
}